

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cash.cpp
# Opt level: O0

void __thiscall
Cash::Cash(Cash *this,int id,int sender,int receiver,double amount,double totalPaid,double changeDue
          )

{
  double changeDue_local;
  double totalPaid_local;
  double amount_local;
  int receiver_local;
  int sender_local;
  int id_local;
  Cash *this_local;
  
  Transaction::Transaction(&this->super_Transaction);
  (this->super_Transaction)._vptr_Transaction = (_func_int **)&PTR_display_00108d88;
  (this->super_Transaction).id = id;
  (this->super_Transaction).sender = sender;
  (this->super_Transaction).receiver = receiver;
  (this->super_Transaction).amount = amount;
  this->totalPaid = totalPaid;
  this->changeDue = changeDue;
  return;
}

Assistant:

Cash::Cash(int id, int sender, int receiver, double amount, double totalPaid, double changeDue)
{
    this->id = id;
    this ->sender = sender;
    this->receiver = receiver;
    this->amount = amount;
    this->totalPaid = totalPaid;
    this->changeDue = changeDue;
}